

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfsintegration.cpp
# Opt level: O3

void __thiscall QEglFSIntegration::QEglFSIntegration(QEglFSIntegration *this)

{
  int iVar1;
  QPlatformFontDatabase *pQVar2;
  
  *(code **)this = qHash;
  QObject::QObject((QObject *)&this->super_QPlatformNativeInterface,(QObject *)0x0);
  *(undefined ***)this = &PTR__QEglFSIntegration_00144ba8;
  *(undefined ***)&this->super_QPlatformNativeInterface = &PTR_metaObject_00144d20;
  *(undefined ***)&this->super_QEvdevKeyMapper = &PTR__QEglFSIntegration_00144e10;
  *(undefined ***)&this->super_QEGLIntegration = &PTR__QEglFSIntegration_00144e40;
  this->m_kbdMgr = (QEvdevKeyboardManager *)0x0;
  this->m_display = (EGLDisplay)0x0;
  this->m_inputContext = (QPlatformInputContext *)0x0;
  pQVar2 = (QPlatformFontDatabase *)operator_new(8);
  *(code **)pQVar2 = QPlatformScreen::currentMode;
  (this->m_fontDb).d = pQVar2;
  (this->m_pointerWindow).wp.d = (Data *)0x0;
  (this->m_pointerWindow).wp.value = (QObject *)0x0;
  (this->m_services).d = (QPlatformServices *)0x0;
  (this->m_vtHandler).d = (QFbVtHandler *)0x0;
  this->m_disableInputHandlers = false;
  iVar1 = qEnvironmentVariableIntValue("QT_QPA_EGLFS_DISABLE_INPUT",(bool *)0x0);
  this->m_disableInputHandlers = iVar1 != 0;
  qInitResources_cursor();
  return;
}

Assistant:

QEglFSIntegration::QEglFSIntegration()
    : m_display(EGL_NO_DISPLAY),
      m_inputContext(nullptr),
      m_fontDb(new QGenericUnixFontDatabase),
      m_disableInputHandlers(false)
{
    m_disableInputHandlers = qEnvironmentVariableIntValue("QT_QPA_EGLFS_DISABLE_INPUT");

    initResources();
}